

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenSolver.h
# Opt level: O1

complex<double> Eigen::cdiv<double>(double *xr,double *xi,double *yr,double *yi)

{
  undefined8 in_RAX;
  complex<double> cVar1;
  complex<double> cVar2;
  
  if (ABS(*yi) < ABS(*yr)) {
    cVar1._M_value._8_8_ = yr;
    cVar1._M_value._0_8_ = in_RAX;
    return (complex<double>)cVar1._M_value;
  }
  cVar2._M_value._8_8_ = yr;
  cVar2._M_value._0_8_ = in_RAX;
  return (complex<double>)cVar2._M_value;
}

Assistant:

std::complex<Scalar> cdiv(const Scalar& xr, const Scalar& xi, const Scalar& yr, const Scalar& yi)
{
  using std::abs;
  Scalar r,d;
  if (abs(yr) > abs(yi))
  {
      r = yi/yr;
      d = yr + r*yi;
      return std::complex<Scalar>((xr + r*xi)/d, (xi - r*xr)/d);
  }
  else
  {
      r = yr/yi;
      d = yi + r*yr;
      return std::complex<Scalar>((r*xr + xi)/d, (r*xi - xr)/d);
  }
}